

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::centerOn(QGraphicsView *this,QPointF *pos)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  LayoutDirection LVar8;
  int iVar9;
  int iVar10;
  QWidget *pQVar11;
  QScrollBar *pQVar12;
  double dVar13;
  double dVar14;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  
  lVar3 = *(long *)(this + 8);
  pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar10 = (pQVar11->data->crect).x2.m_i;
  iVar9 = (pQVar11->data->crect).x1.m_i;
  pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar1 = (pQVar11->data->crect).y2.m_i;
  iVar2 = (pQVar11->data->crect).y1.m_i;
  dVar13 = (double)QTransform::map((QPointF *)(lVar3 + 0x3a0));
  uVar4 = *(undefined4 *)&pos->xp;
  uVar5 = *(undefined4 *)((long)&pos->xp + 4);
  uVar6 = *(undefined4 *)&pos->yp;
  uVar7 = *(undefined4 *)((long)&pos->yp + 4);
  if ((*(double *)(lVar3 + 0x400) == 0.0) && (!NAN(*(double *)(lVar3 + 0x400)))) {
    dVar14 = (double)((iVar10 - iVar9) + 1);
    LVar8 = QWidget::layoutDirection((QWidget *)this);
    pQVar12 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    if (LVar8 == RightToLeft) {
      iVar9 = QAbstractSlider::minimum(&pQVar12->super_QAbstractSlider);
      pQVar12 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar10 = QAbstractSlider::maximum(&pQVar12->super_QAbstractSlider);
      dVar13 = dVar13 - dVar14 * 0.5;
      iVar10 = (iVar9 - (int)((double)((ulong)dVar13 & 0x8000000000000000 | (ulong)DAT_0066f5c0) +
                             dVar13)) + iVar10;
      pQVar12 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    }
    else {
      dVar13 = dVar13 - dVar14 * 0.5;
      iVar10 = (int)((double)((ulong)dVar13 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar13);
    }
    QAbstractSlider::setValue(&pQVar12->super_QAbstractSlider,iVar10);
  }
  if ((*(double *)(lVar3 + 0x408) == 0.0) && (!NAN(*(double *)(lVar3 + 0x408)))) {
    pQVar12 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    dVar13 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - (double)((iVar1 - iVar2) + 1) * 0.5;
    QAbstractSlider::setValue
              (&pQVar12->super_QAbstractSlider,
               (int)((double)((ulong)dVar13 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar13));
  }
  *(undefined4 *)(lVar3 + 0x468) = uVar4;
  *(undefined4 *)(lVar3 + 0x46c) = uVar5;
  *(undefined4 *)(lVar3 + 0x470) = uVar6;
  *(undefined4 *)(lVar3 + 0x474) = uVar7;
  return;
}

Assistant:

void QGraphicsView::centerOn(const QPointF &pos)
{
    Q_D(QGraphicsView);
    qreal width = viewport()->width();
    qreal height = viewport()->height();
    QPointF viewPoint = d->matrix.map(pos);
    QPointF oldCenterPoint = pos;

    if (!d->leftIndent) {
        if (isRightToLeft()) {
            qint64 horizontal = 0;
            horizontal += horizontalScrollBar()->minimum();
            horizontal += horizontalScrollBar()->maximum();
            horizontal -= qRound(viewPoint.x() - width / 2.0);
            horizontalScrollBar()->setValue(horizontal);
        } else {
            horizontalScrollBar()->setValue(qRound(viewPoint.x() - width / 2.0));
        }
    }
    if (!d->topIndent)
        verticalScrollBar()->setValue(qRound(viewPoint.y() - height / 2.0));
    d->lastCenterPoint = oldCenterPoint;
}